

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O3

int enet_socket_set_option(ENetSocket socket,ENetSocketOption option,int value)

{
  int iVar1;
  long *__optval;
  int __level;
  socklen_t __optlen;
  timeval timeVal;
  undefined1 local_14 [4];
  long local_10;
  long local_8;
  
  iVar1 = -1;
  local_14 = (undefined1  [4])value;
  switch(option) {
  case ENET_SOCKOPT_NONBLOCK:
    iVar1 = ioctl(socket,0x5421,local_14);
    goto switchD_0016245b_caseD_8;
  case ENET_SOCKOPT_BROADCAST:
    __level = 1;
    iVar1 = 6;
    break;
  case ENET_SOCKOPT_RCVBUF:
    __level = 1;
    iVar1 = 8;
    break;
  case ENET_SOCKOPT_SNDBUF:
    __level = 1;
    iVar1 = 7;
    break;
  case ENET_SOCKOPT_REUSEADDR:
    __level = 1;
    iVar1 = 2;
    break;
  case ENET_SOCKOPT_RCVTIMEO:
    iVar1 = 0x14;
    goto LAB_0016251b;
  case ENET_SOCKOPT_SNDTIMEO:
    iVar1 = 0x15;
LAB_0016251b:
    local_8 = (long)((value % 1000) * 1000);
    local_10 = (long)(value / 1000);
    __optval = &local_10;
    __level = 1;
    __optlen = 0x10;
    goto LAB_0016256b;
  default:
    goto switchD_0016245b_caseD_8;
  case ENET_SOCKOPT_NODELAY:
    __level = 6;
    iVar1 = 1;
    break;
  case ENET_SOCKOPT_KEEPALIVE:
    __level = 1;
    iVar1 = 9;
  }
  __optval = (long *)local_14;
  __optlen = 4;
LAB_0016256b:
  iVar1 = setsockopt(socket,__level,iVar1,__optval,__optlen);
switchD_0016245b_caseD_8:
  return -(uint)(iVar1 == -1);
}

Assistant:

int
enet_socket_set_option (ENetSocket socket, ENetSocketOption option, int value)
{
    int result = -1;
    switch (option)
    {
        case ENET_SOCKOPT_NONBLOCK:
#ifdef HAS_FCNTL
            result = fcntl (socket, F_SETFL, (value ? O_NONBLOCK : 0) | (fcntl (socket, F_GETFL) & ~O_NONBLOCK));
#else
            result = ioctl (socket, FIONBIO, & value);
#endif
            break;

        case ENET_SOCKOPT_BROADCAST:
            result = setsockopt (socket, SOL_SOCKET, SO_BROADCAST, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_REUSEADDR:
            result = setsockopt (socket, SOL_SOCKET, SO_REUSEADDR, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_RCVBUF:
            result = setsockopt (socket, SOL_SOCKET, SO_RCVBUF, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_SNDBUF:
            result = setsockopt (socket, SOL_SOCKET, SO_SNDBUF, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_RCVTIMEO:
        {
            struct timeval timeVal;
            timeVal.tv_sec = value / 1000;
            timeVal.tv_usec = (value % 1000) * 1000;
            result = setsockopt (socket, SOL_SOCKET, SO_RCVTIMEO, (char *) & timeVal, sizeof (struct timeval));
            break;
        }

        case ENET_SOCKOPT_SNDTIMEO:
        {
            struct timeval timeVal;
            timeVal.tv_sec = value / 1000;
            timeVal.tv_usec = (value % 1000) * 1000;
            result = setsockopt (socket, SOL_SOCKET, SO_SNDTIMEO, (char *) & timeVal, sizeof (struct timeval));
            break;
        }

        case ENET_SOCKOPT_NODELAY:
            result = setsockopt (socket, IPPROTO_TCP, TCP_NODELAY, (char *) & value, sizeof (int));
            break;
        case ENET_SOCKOPT_KEEPALIVE:
            result = setsockopt (socket, SOL_SOCKET, SO_KEEPALIVE, (char *) & value, sizeof (int));
                  break;

        default:
            break;
    }
    return result == -1 ? -1 : 0;
}